

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_14::fpToString<double>(double value,int precision)

{
  ostream *this;
  char *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double in_XMM0_Qa;
  size_t i;
  string d;
  ostringstream oss;
  size_type in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  int local_194;
  ostringstream local_190 [380];
  int local_14;
  double local_10;
  
  this_01 = in_RDI;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = (int)std::setprecision(local_14);
  this = std::operator<<((ostream *)local_190,(_Setprecision)local_194);
  in = (char *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(in,local_10);
  std::__cxx11::ostringstream::str();
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(this_01,(char)((ulong)in_RDI >> 0x38),(size_type)in);
  if (this_00 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
    this_02 = this_00;
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_1c8);
    in_stack_fffffffffffffde0 = this_00;
    if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 - 1))
    {
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](this_00,in_stack_fffffffffffffdd8);
      if (*pvVar2 == '.') {
        this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(this_02->_M_dataplus)._M_p + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this_01,(size_type)in_RDI,(size_type)in);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_02,in_stack_fffffffffffffe28);
      std::__cxx11::string::~string(this_00);
      in_stack_fffffffffffffde0 = this_00;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x114fbc);
  String::String((String *)in_RDI,in);
  std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return (String *)this_01;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }